

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O1

bool __thiscall GF2::VSubst<8UL>::IsFullCycle(VSubst<8UL> *this)

{
  word wVar1;
  long lVar2;
  
  wVar1 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[0]._words[0];
  if (wVar1 != 0) {
    lVar2 = 0xff;
    do {
      wVar1 = (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[wVar1]._words[0];
      lVar2 = lVar2 + -1;
    } while (wVar1 != 0);
    return lVar2 == 0;
  }
  return false;
}

Assistant:

bool IsFullCycle() const
	{	
		assert(IsBijection());
		word x = Get(0);
		size_t count = 1;
		while (x != 0)
			x = Get(x), ++count;
		return count == _size;
	}